

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O0

void calc_interp_skip_pred_flag(MACROBLOCK *x,AV1_COMP *cpi,int *skip_hor,int *skip_ver)

{
  MB_MODE_INFO *mbmi_00;
  int iVar1;
  int iVar2;
  int iVar3;
  MV MVar4;
  long lVar5;
  uint *in_RCX;
  uint *in_RDX;
  long in_RSI;
  long in_RDI;
  int sub_y;
  int sub_x;
  MV mv_q4;
  int bh;
  int bw;
  macroblockd_plane *pd;
  int plane_idx;
  int skip_ver_plane;
  int skip_hor_plane;
  MV mv;
  scale_factors *sf;
  int ref;
  int is_compound;
  int num_planes;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  short local_74;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  int local_44;
  
  mbmi_00 = (MB_MODE_INFO *)**(undefined8 **)(in_RDI + 0x2058);
  iVar1 = av1_num_planes((AV1_COMMON *)(in_RSI + 0x3bf80));
  iVar2 = has_second_ref(mbmi_00);
  local_44 = 0;
  do {
    if (iVar2 + 1 <= local_44) {
LAB_00705e54:
      if ((((iVar2 != 0) && (((byte)((ushort)*(undefined2 *)&mbmi_00->field_0xa7 >> 9) & 1) == 1))
          && ((mbmi_00->interinter_comp).type == '\x03')) && ((*in_RDX == 0 && (*in_RCX == 1)))) {
        *in_RCX = 0;
      }
      return;
    }
    get_ref_scale_factors_const
              ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffff7c >> 0x18));
    iVar3 = av1_is_scaled((scale_factors *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (iVar3 != 0) {
      *in_RDX = 0;
      *in_RCX = 0;
      goto LAB_00705e54;
    }
    uVar8 = mbmi_00->mv[local_44].as_int;
    uVar7 = 0;
    uVar6 = 0;
    in_stack_ffffffffffffff80 = 0;
    while( true ) {
      if (iVar1 + -1 < 1) {
        in_stack_ffffffffffffff7c = 1;
      }
      else {
        in_stack_ffffffffffffff7c = iVar1 + -1;
      }
      if (in_stack_ffffffffffffff7c <= in_stack_ffffffffffffff80) break;
      lVar5 = in_RDI + 0x1b0 + (long)in_stack_ffffffffffffff80 * 0xa30;
      MVar4 = clamp_mv_to_umv_border_sb
                        ((MACROBLOCKD *)CONCAT44(uVar8,uVar7),
                         (MV *)CONCAT44(uVar6,in_stack_ffffffffffffff80),(int)((ulong)lVar5 >> 0x20)
                         ,(int)lVar5,(uint)*(byte *)(lVar5 + 0xa8),(uint)*(byte *)(lVar5 + 0xa9));
      local_74 = MVar4.row;
      in_stack_ffffffffffffff84 = ((int)local_74 & 0xfU) << 6;
      uVar7 = (uint)(((uint)MVar4 & 0xf0000) == 0) << ((byte)in_stack_ffffffffffffff80 & 0x1f) |
              uVar7;
      uVar6 = (uint)(((int)local_74 & 0xfU) == 0) << ((byte)in_stack_ffffffffffffff80 & 0x1f) |
              uVar6;
      in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 + 1;
    }
    *in_RDX = uVar7 & *in_RDX;
    *in_RCX = uVar6 & *in_RCX;
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

static inline void calc_interp_skip_pred_flag(MACROBLOCK *const x,
                                              const AV1_COMP *const cpi,
                                              int *skip_hor, int *skip_ver) {
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int num_planes = av1_num_planes(cm);
  const int is_compound = has_second_ref(mbmi);
  assert(is_intrabc_block(mbmi) == 0);
  for (int ref = 0; ref < 1 + is_compound; ++ref) {
    const struct scale_factors *const sf =
        get_ref_scale_factors_const(cm, mbmi->ref_frame[ref]);
    // TODO(any): Refine skip flag calculation considering scaling
    if (av1_is_scaled(sf)) {
      *skip_hor = 0;
      *skip_ver = 0;
      break;
    }
    const MV mv = mbmi->mv[ref].as_mv;
    int skip_hor_plane = 0;
    int skip_ver_plane = 0;
    for (int plane_idx = 0; plane_idx < AOMMAX(1, (num_planes - 1));
         ++plane_idx) {
      struct macroblockd_plane *const pd = &xd->plane[plane_idx];
      const int bw = pd->width;
      const int bh = pd->height;
      const MV mv_q4 = clamp_mv_to_umv_border_sb(
          xd, &mv, bw, bh, pd->subsampling_x, pd->subsampling_y);
      const int sub_x = (mv_q4.col & SUBPEL_MASK) << SCALE_EXTRA_BITS;
      const int sub_y = (mv_q4.row & SUBPEL_MASK) << SCALE_EXTRA_BITS;
      skip_hor_plane |= ((sub_x == 0) << plane_idx);
      skip_ver_plane |= ((sub_y == 0) << plane_idx);
    }
    *skip_hor &= skip_hor_plane;
    *skip_ver &= skip_ver_plane;
    // It is not valid that "luma MV is sub-pel, whereas chroma MV is not"
    assert(*skip_hor != 2);
    assert(*skip_ver != 2);
  }
  // When compond prediction type is compound segment wedge, luma MC and chroma
  // MC need to go hand in hand as mask generated during luma MC is reuired for
  // chroma MC. If skip_hor = 0 and skip_ver = 1, mask used for chroma MC during
  // vertical filter decision may be incorrect as temporary MC evaluation
  // overwrites the mask. Make skip_ver as 0 for this case so that mask is
  // populated during luma MC
  if (is_compound && mbmi->compound_idx == 1 &&
      mbmi->interinter_comp.type == COMPOUND_DIFFWTD) {
    assert(mbmi->comp_group_idx == 1);
    if (*skip_hor == 0 && *skip_ver == 1) *skip_ver = 0;
  }
}